

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9FFTest(Abc_Frame_t *pAbc,int argc,char **argv)

{
  char cVar1;
  int iVar2;
  Io_FileType_t FileType;
  int iVar3;
  Abc_Ntk_t *pNtk;
  Abc_Ntk_t *pNtk_00;
  Gia_Man_t *pGVar4;
  char **ppNamesIn_00;
  size_t sVar5;
  FILE *pFVar6;
  char *pcVar7;
  Gia_Man_t *local_108;
  FILE *pFile_2;
  FILE *pFile_1;
  char Char;
  int Len;
  FILE *pFile;
  char **ppNamesIn;
  Gia_Man_t *pGia;
  Abc_Ntk_t *pNtk3;
  Abc_Ntk_t *pNtk2;
  Gia_Man_t *pGStack_98;
  int c;
  Gia_Man_t *pGold;
  char *pFileName2;
  char *pFileName;
  Bmc_ParFf_t *pPars;
  Bmc_ParFf_t Pars;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pFileName = (char *)&pPars;
  pFileName2 = (char *)0x0;
  pGold = (Gia_Man_t *)0x0;
  pGStack_98 = (Gia_Man_t *)0x0;
  Pars._72_8_ = argv;
  Gia_ParFfSetDefault((Bmc_ParFf_t *)pFileName);
  Extra_UtilGetoptReset();
LAB_002bd9ac:
  do {
    iVar2 = Extra_UtilGetopt(argc,(char **)Pars._72_8_,"ATNKSGFkbsfcdeunvh");
    if (iVar2 == -1) {
      if (pGold == (Gia_Man_t *)0x0) goto LAB_002bdfd9;
      pcVar7 = Extra_FileNameExtension((char *)pGold);
      iVar2 = strcmp(pcVar7,"blif");
      pGVar4 = pGold;
      if (iVar2 != 0) {
        pFVar6 = fopen((char *)pGold,"r");
        if (pFVar6 == (FILE *)0x0) {
          Abc_Print(-1,"Abc_CommandAbc9FFTest(): File name \"%s\" with formula is invalid.\n",pGold)
          ;
          return 0;
        }
        pcVar7 = Extra_FileRead((FILE *)pFVar6);
        *(char **)(pFileName + 8) = pcVar7;
        fclose(pFVar6);
        while( true ) {
          sVar5 = strlen(*(char **)(pFileName + 8));
          cVar1 = *(char *)(*(long *)(pFileName + 8) + (long)((int)sVar5 + -1));
          if ((((cVar1 != ' ') && (cVar1 != '\n')) && (cVar1 != '\r')) &&
             ((cVar1 != '\t' && (cVar1 != -0x33)))) break;
          *(undefined1 *)(*(long *)(pFileName + 8) + (long)((int)sVar5 + -1)) = 0;
        }
LAB_002bdfbc:
        printf("Using formula \"%s\" from file \"%s\".\n",*(undefined8 *)(pFileName + 8),pGold);
LAB_002bdfd9:
        if ((*(int *)(pFileName + 0x10) == 0) && (*(long *)(pFileName + 8) == 0)) {
          Abc_Print(-1,"Formula string (-S <str>) should be selected when algorithm is 0 (-A 0).\n")
          ;
          return 0;
        }
        if ((*(int *)(pFileName + 0x10) != 0) && (*(long *)(pFileName + 8) != 0)) {
          Abc_Print(-1,"Algorithm should be 0 (-A 0) when formula string is selected (-S <str>).\n")
          ;
          return 0;
        }
        if (argc == globalUtilOptind + 1) {
          *(undefined8 *)pFileName = *(undefined8 *)(Pars._72_8_ + (long)globalUtilOptind * 8);
          pFVar6 = fopen(*(char **)pFileName,"r");
          if (pFVar6 == (FILE *)0x0) {
            Abc_Print(-1,"Cannot open file \"%s\" with the input test patterns.\n",
                      *(undefined8 *)pFileName);
            return 0;
          }
          fclose(pFVar6);
        }
        if (pAbc->pGia == (Gia_Man_t *)0x0) {
          Abc_Print(-1,"Abc_CommandAbc9FFTest(): There is no AIG.\n");
          return 0;
        }
        iVar2 = Gia_ManRegNum(pAbc->pGia);
        if ((iVar2 == 0) && (*(int *)(pFileName + 0x10) == 1)) {
          Abc_Print(-1,"Abc_CommandAbc9FFTest(): For delay testing, AIG should be sequential.\n");
          return 0;
        }
        if (pFileName2 != (char *)0x0) {
          pFVar6 = fopen(pFileName2,"r");
          if (pFVar6 == (FILE *)0x0) {
            Abc_Print(-1,"Abc_CommandAbc9FFTest(): File name \"%s\" with golden model is invalid.\n"
                      ,pFileName2);
            return 0;
          }
          fclose(pFVar6);
          pGStack_98 = Gia_AigerRead(pFileName2,0,0,0);
          if (pGStack_98 == (Gia_Man_t *)0x0) {
            Abc_Print(-1,"Abc_CommandAbc9FFTest(): Cannot read file \"%s\" with golden model.\n",
                      pFileName2);
            return 0;
          }
          iVar2 = Gia_ManPiNum(pAbc->pGia);
          iVar3 = Gia_ManPiNum(pGStack_98);
          if (iVar2 != iVar3) {
            Gia_ManStop(pGStack_98);
            Abc_Print(-1,
                      "Abc_CommandAbc9FFTest(): Old model and gold model have different number of PIs.\n"
                     );
            return 0;
          }
          iVar2 = Gia_ManPoNum(pAbc->pGia);
          iVar3 = Gia_ManPoNum(pGStack_98);
          if (iVar2 != iVar3) {
            Gia_ManStop(pGStack_98);
            Abc_Print(-1,
                      "Abc_CommandAbc9FFTest(): Old model and gold model have different number of POs.\n"
                     );
            return 0;
          }
          printf("Entered spec AIG from file \"%s\".\n",pFileName2);
        }
        if (pGStack_98 == (Gia_Man_t *)0x0) {
          local_108 = pAbc->pGia;
        }
        else {
          local_108 = pGStack_98;
        }
        Gia_ManFaultTest(pAbc->pGia,local_108,(Bmc_ParFf_t *)pFileName);
        Gia_ManStopP(&stack0xffffffffffffff68);
        if ((pGold != (Gia_Man_t *)0x0) && (*(long *)(pFileName + 8) != 0)) {
          free(*(void **)(pFileName + 8));
          pFileName[8] = '\0';
          pFileName[9] = '\0';
          pFileName[10] = '\0';
          pFileName[0xb] = '\0';
          pFileName[0xc] = '\0';
          pFileName[0xd] = '\0';
          pFileName[0xe] = '\0';
          pFileName[0xf] = '\0';
        }
        return 0;
      }
      FileType = Io_ReadFileType((char *)pGold);
      pNtk = Io_Read((char *)pGVar4,FileType,1,0);
      pNtk_00 = Abc_NtkStrash(pNtk,0,0,0);
      pGVar4 = Abc_NtkClpGia(pNtk_00);
      ppNamesIn_00 = Abc_NtkCollectCioNames(pNtk,0);
      iVar2 = Gia_ManCoNum(pGVar4);
      if (iVar2 == 1) {
        pcVar7 = Gia_DeriveFormula(pGVar4,ppNamesIn_00);
        *(char **)(pFileName + 8) = pcVar7;
      }
      else {
        printf("The formula BLIF file contains the network with more one output.\n");
      }
      if (ppNamesIn_00 != (char **)0x0) {
        free(ppNamesIn_00);
      }
      Gia_ManStop(pGVar4);
      Abc_NtkDelete(pNtk);
      Abc_NtkDelete(pNtk_00);
      if (*(long *)(pFileName + 8) != 0) goto LAB_002bdfbc;
      goto LAB_002be32f;
    }
    switch(iVar2) {
    case 0x41:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-A\" should be followed by an integer.\n");
        goto LAB_002be32f;
      }
      iVar2 = atoi(*(char **)(Pars._72_8_ + (long)globalUtilOptind * 8));
      *(int *)(pFileName + 0x10) = iVar2;
      globalUtilOptind = globalUtilOptind + 1;
      if ((*(int *)(pFileName + 0x10) < 0) || (4 < *(int *)(pFileName + 0x10))) goto LAB_002be32f;
      goto LAB_002bd9ac;
    default:
      goto LAB_002be32f;
    case 0x46:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-F\" should be followed by a file name.\n");
        goto LAB_002be32f;
      }
      pGold = *(Gia_Man_t **)(Pars._72_8_ + (long)globalUtilOptind * 8);
      globalUtilOptind = globalUtilOptind + 1;
      goto LAB_002bd9ac;
    case 0x47:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-G\" should be followed by a file name.\n");
        goto LAB_002be32f;
      }
      pFileName2 = *(char **)(Pars._72_8_ + (long)globalUtilOptind * 8);
      globalUtilOptind = globalUtilOptind + 1;
      goto LAB_002bd9ac;
    case 0x4b:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-K\" should be followed by an integer.\n");
        goto LAB_002be32f;
      }
      iVar2 = atoi(*(char **)(Pars._72_8_ + (long)globalUtilOptind * 8));
      *(int *)(pFileName + 0x24) = iVar2;
      globalUtilOptind = globalUtilOptind + 1;
      if (*(int *)(pFileName + 0x24) < 1) goto LAB_002be32f;
      goto LAB_002bd9ac;
    case 0x4e:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-N\" should be followed by an integer.\n");
        goto LAB_002be32f;
      }
      iVar2 = atoi(*(char **)(Pars._72_8_ + (long)globalUtilOptind * 8));
      *(int *)(pFileName + 0x20) = iVar2;
      iVar2 = *(int *)(pFileName + 0x20);
      break;
    case 0x53:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-S\" should be followed by a string.\n");
        goto LAB_002be32f;
      }
      *(undefined8 *)(pFileName + 8) = *(undefined8 *)(Pars._72_8_ + (long)globalUtilOptind * 8);
      globalUtilOptind = globalUtilOptind + 1;
      goto LAB_002bd9ac;
    case 0x54:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-T\" should be followed by an integer.\n");
        goto LAB_002be32f;
      }
      iVar2 = atoi(*(char **)(Pars._72_8_ + (long)globalUtilOptind * 8));
      *(int *)(pFileName + 0x1c) = iVar2;
      iVar2 = *(int *)(pFileName + 0x1c);
      break;
    case 0x62:
      *(uint *)(pFileName + 0x2c) = *(uint *)(pFileName + 0x2c) ^ 1;
      goto LAB_002bd9ac;
    case 99:
      *(uint *)(pFileName + 0x34) = *(uint *)(pFileName + 0x34) ^ 1;
      goto LAB_002bd9ac;
    case 100:
      *(uint *)(pFileName + 0x38) = *(uint *)(pFileName + 0x38) ^ 1;
      goto LAB_002bd9ac;
    case 0x65:
      *(uint *)(pFileName + 0x3c) = *(uint *)(pFileName + 0x3c) ^ 1;
      goto LAB_002bd9ac;
    case 0x66:
      *(uint *)(pFileName + 0x30) = *(uint *)(pFileName + 0x30) ^ 1;
      goto LAB_002bd9ac;
    case 0x68:
      goto LAB_002be32f;
    case 0x6b:
      *(uint *)(pFileName + 0x28) = *(uint *)(pFileName + 0x28) ^ 1;
      goto LAB_002bd9ac;
    case 0x6e:
      *(uint *)(pFileName + 0x44) = *(uint *)(pFileName + 0x44) ^ 1;
      goto LAB_002bd9ac;
    case 0x73:
      *(uint *)(pFileName + 0x18) = *(uint *)(pFileName + 0x18) ^ 1;
      goto LAB_002bd9ac;
    case 0x75:
      *(uint *)(pFileName + 0x40) = *(uint *)(pFileName + 0x40) ^ 1;
      goto LAB_002bd9ac;
    case 0x76:
      *(uint *)(pFileName + 0x48) = *(uint *)(pFileName + 0x48) ^ 1;
      goto LAB_002bd9ac;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if (iVar2 < 0) {
LAB_002be32f:
      Abc_Print(-2,"usage: &fftest [-ATNK num] [-kbsfcdeunvh] <file> [-GF file] [-S str]\n");
      Abc_Print(-2,"\t          performs functional fault test generation\n");
      Abc_Print(-2,"\t-A num  : selects fault model for all gates [default = %d]\n",
                (ulong)*(uint *)(pFileName + 0x10));
      Abc_Print(-2,"\t                0: fault model is not selected (use -S str)\n");
      Abc_Print(-2,"\t                1: delay fault testing for sequential circuits\n");
      Abc_Print(-2,"\t                2: traditional stuck-at fault: -S (((a&b)&~p)|q)\n");
      Abc_Print(-2,"\t                3: complement fault: -S ((a&b)^p)\n");
      Abc_Print(-2,"\t                4: functionally observable fault\n");
      Abc_Print(-2,"\t-T num  : specifies approximate runtime limit in seconds [default = %d]\n",
                (ulong)*(uint *)(pFileName + 0x1c));
      Abc_Print(-2,"\t-N num  : specifies iteration to check for fixed parameters [default = %d]\n",
                (ulong)*(uint *)(pFileName + 0x20));
      Abc_Print(-2,"\t-K num  : specifies cardinality constraint (num > 0) [default = unused]\n");
      pcVar7 = "no";
      if (*(int *)(pFileName + 0x28) != 0) {
        pcVar7 = "yes";
      }
      Abc_Print(-2,
                "\t-k      : toggles non-strict cardinality (n <= K, instead of n == K) [default = %s]\n"
                ,pcVar7);
      pcVar7 = "no";
      if (*(int *)(pFileName + 0x2c) != 0) {
        pcVar7 = "yes";
      }
      Abc_Print(-2,
                "\t-b      : toggles testing for single faults (the same as \"-K 1\") [default = %s]\n"
                ,pcVar7);
      pcVar7 = "no";
      if (*(int *)(pFileName + 0x18) != 0) {
        pcVar7 = "yes";
      }
      Abc_Print(-2,"\t-s      : toggles starting with the all-0 and all-1 patterns [default = %s]\n"
                ,pcVar7);
      pcVar7 = "no";
      if (*(int *)(pFileName + 0x30) != 0) {
        pcVar7 = "yes";
      }
      Abc_Print(-2,
                "\t-f      : toggles faults at flop inputs only with \"-A 1\" and \"-S str\" [default = %s]\n"
                ,pcVar7);
      pcVar7 = "no";
      if (*(int *)(pFileName + 0x34) != 0) {
        pcVar7 = "yes";
      }
      Abc_Print(-2,"\t-c      : toggles checking if there are untestable faults [default = %s]\n",
                pcVar7);
      pcVar7 = "no";
      if (*(int *)(pFileName + 0x38) != 0) {
        pcVar7 = "yes";
      }
      Abc_Print(-2,
                "\t-d      : toggles dumping test patterns into file \"<file>_tests.txt\" [default = %s]\n"
                ,pcVar7);
      pcVar7 = "no";
      if (*(int *)(pFileName + 0x3c) != 0) {
        pcVar7 = "yes";
      }
      Abc_Print(-2,
                "\t-e      : toggles dumping test pattern pairs (delay faults only) [default = %s]\n"
                ,pcVar7);
      pcVar7 = "no";
      if (*(int *)(pFileName + 0x40) != 0) {
        pcVar7 = "yes";
      }
      Abc_Print(-2,
                "\t-u      : toggles dumping untestable faults into \"<file>_untest.txt\" [default = %s]\n"
                ,pcVar7);
      pcVar7 = "no";
      if (*(int *)(pFileName + 0x44) != 0) {
        pcVar7 = "yes";
      }
      Abc_Print(-2,
                "\t-n      : toggles dumping faults not detected by a given test set [default = %s]\n"
                ,pcVar7);
      pcVar7 = "no";
      if (*(int *)(pFileName + 0x48) != 0) {
        pcVar7 = "yes";
      }
      Abc_Print(-2,"\t-v      : toggles printing verbose information [default = %s]\n",pcVar7);
      Abc_Print(-2,"\t-h      : print the command usage\n");
      Abc_Print(-2,"\t<file>  : (optional) file name with input test patterns\n\n");
      Abc_Print(-2,"\t-G file : (optional) file name with the golden model\n\n");
      Abc_Print(-2,"\t-F file : (optional) file name with the fault model in BLIF format\n");
      Abc_Print(-2,"\t-S str  : (optional) string representing the fault model\n");
      Abc_Print(-2,"\t          The following notations are used:\n");
      Abc_Print(-2,"\t            Functional variables: {a,b} (both a and b are always present)\n");
      Abc_Print(-2,"\t            Parameter variables: {p,q,r,s,t,u,v,w} (any number from 1 to 8)\n"
               );
      Abc_Print(-2,"\t            Boolean operators: AND(&), OR(|), XOR(^), MUX(?:), NOT(~)\n");
      Abc_Print(-2,
                "\t            Parentheses should be used around each operator. Spaces not allowed.\n"
               );
      Abc_Print(-2,
                "\t            Complement (~) is only allowed before variables (use DeMorgan law).\n"
               );
      Abc_Print(-2,"\t            Examples:\n");
      Abc_Print(-2,"\t              (((a&b)&~p)|q)        stuck-at-0/1 at the output\n");
      Abc_Print(-2,"\t              (((a&~p)|q)&b)        stuck-at-0/1 at input a\n");
      Abc_Print(-2,
                "\t              (((a|p)&(b|q))&~r)    stuck-at-1 at the inputs and stuck-at-0 at the output\n"
               );
      Abc_Print(-2,
                "\t              (((a&~p)&(b&~q))|r)   stuck-at-0 at the inputs and stuck-at-1 at the output\n"
               );
      Abc_Print(-2,"\t              ((a&b)^p)             complement at the output\n");
      Abc_Print(-2,
                "\t              (((a^p)&(b^q))^r)     complement at the inputs and at the output\n"
               );
      Abc_Print(-2,
                "\t              (a?(b?~s:r):(b?q:p))  functionally observable fault at the output\n"
               );
      Abc_Print(-2,"\t              (p?(a|b):(a&b))       replace AND by OR\n");
      Abc_Print(-2,
                "\t           If the BLIF file is used for the formula with option \'-F\', following rules apply:\n"
               );
      Abc_Print(-2,
                "\t              - the network should be combinational and have exactly one primary output\n"
               );
      Abc_Print(-2,"\t              - input names should have only one character:\n");
      Abc_Print(-2,"\t                {a, b} (for functional variables)\n");
      Abc_Print(-2,"\t                {p,q,r,s,t,u,v,w} (for parameter variables)\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9FFTest( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Gia_ParFfSetDefault( Bmc_ParFf_t * p );
    extern void Gia_ManFaultTest( Gia_Man_t * p, Gia_Man_t * pG, Bmc_ParFf_t * pPars );
    Bmc_ParFf_t Pars, * pPars = &Pars;
    char * pFileName = NULL, * pFileName2 = NULL;
    Gia_Man_t * pGold = NULL;
    int c;
    Gia_ParFfSetDefault( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "ATNKSGFkbsfcdeunvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'A':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-A\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->Algo = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->Algo < 0 || pPars->Algo > 4 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nTimeOut = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nTimeOut < 0 )
                goto usage;
            break;
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nIterCheck = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nIterCheck < 0 )
                goto usage;
            break;
        case 'K':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-K\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nCardConstr = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nCardConstr <= 0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by a string.\n" );
                goto usage;
            }
            pPars->pFormStr = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by a file name.\n" );
                goto usage;
            }
            pFileName2 = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 'G':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-G\" should be followed by a file name.\n" );
                goto usage;
            }
            pFileName = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 'k':
            pPars->fNonStrict ^= 1;
            break;
        case 'b':
            pPars->fBasic ^= 1;
            break;
        case 's':
            pPars->fStartPats ^= 1;
            break;
        case 'f':
            pPars->fFfOnly ^= 1;
            break;
        case 'c':
            pPars->fCheckUntest ^= 1;
            break;
        case 'd':
            pPars->fDump ^= 1;
            break;
        case 'e':
            pPars->fDumpDelay ^= 1;
            break;
        case 'u':
            pPars->fDumpUntest ^= 1;
            break;
        case 'n':
            pPars->fDumpNewFaults ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    // read string from file
    if ( pFileName2 )
    {
        if ( !strcmp( Extra_FileNameExtension(pFileName2), "blif" ) )
        {
            extern char * Gia_DeriveFormula( Gia_Man_t * pGia, char ** ppNamesIn );
            Abc_Ntk_t * pNtk2 = Io_Read( pFileName2, Io_ReadFileType(pFileName2), 1, 0 );
            Abc_Ntk_t * pNtk3 = Abc_NtkStrash( pNtk2, 0, 0, 0 );
            Gia_Man_t * pGia  = Abc_NtkClpGia( pNtk3 );
            char ** ppNamesIn = Abc_NtkCollectCioNames( pNtk2, 0 );
            if ( Gia_ManCoNum(pGia) == 1 )
                pPars->pFormStr = Gia_DeriveFormula( pGia, ppNamesIn );
            else
                printf( "The formula BLIF file contains the network with more one output.\n" );
            ABC_FREE( ppNamesIn );
            Gia_ManStop( pGia );
            Abc_NtkDelete( pNtk2 );
            Abc_NtkDelete( pNtk3 );
            if ( pPars->pFormStr == NULL )
                goto usage;
        }
        else
        {
            FILE * pFile = fopen( pFileName2, "r" );
            if ( pFile == NULL )
            {
                Abc_Print( -1, "Abc_CommandAbc9FFTest(): File name \"%s\" with formula is invalid.\n", pFileName2 );
                return 0;
            }
            pPars->pFormStr = Extra_FileRead(pFile);
            fclose( pFile );
            // skip spaces
            while ( 1 )
            {
                int Len = strlen(pPars->pFormStr);
                char Char = pPars->pFormStr[Len-1];
                if ( Char == ' ' || Char == '\n' || Char == '\r' || Char == '\t' || Char == -51 )
                    pPars->pFormStr[Len-1] = '\0';
                else
                    break;
            }
        }
        printf( "Using formula \"%s\" from file \"%s\".\n", pPars->pFormStr, pFileName2 );
    }
    if ( pPars->Algo == 0 && pPars->pFormStr == NULL )
    {
        Abc_Print( -1, "Formula string (-S <str>) should be selected when algorithm is 0 (-A 0).\n" );
        return 0;
    }
    if ( pPars->Algo != 0 && pPars->pFormStr != NULL )
    {
        Abc_Print( -1, "Algorithm should be 0 (-A 0) when formula string is selected (-S <str>).\n" );
        return 0;
    }
    // get the file name
    if ( argc == globalUtilOptind + 1 )
    {
        FILE * pFile;
        pPars->pFileName = argv[globalUtilOptind];
        pFile = fopen( pPars->pFileName, "r" );
        if ( pFile == NULL )
        {
            Abc_Print( -1, "Cannot open file \"%s\" with the input test patterns.\n", pPars->pFileName );
            return 0;
        }
        fclose( pFile );
    }
    // check other conditions
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9FFTest(): There is no AIG.\n" );
        return 0;
    }
    if ( Gia_ManRegNum(pAbc->pGia) == 0 && pPars->Algo == 1 )
    {
        Abc_Print( -1, "Abc_CommandAbc9FFTest(): For delay testing, AIG should be sequential.\n" );
        return 0;
    }
    // check if the file is valid
    if ( pFileName )
    {
        FILE * pFile = fopen( pFileName, "r" );
        if ( pFile == NULL )
        {
            Abc_Print( -1, "Abc_CommandAbc9FFTest(): File name \"%s\" with golden model is invalid.\n", pFileName );
            return 0;
        }
        fclose( pFile );
        pGold = Gia_AigerRead( pFileName, 0, 0, 0 );
        if ( pGold == NULL )
        {
            Abc_Print( -1, "Abc_CommandAbc9FFTest(): Cannot read file \"%s\" with golden model.\n", pFileName );
            return 0;
        }
        if ( Gia_ManPiNum(pAbc->pGia) != Gia_ManPiNum(pGold) )
        {
            Gia_ManStop( pGold );
            Abc_Print( -1, "Abc_CommandAbc9FFTest(): Old model and gold model have different number of PIs.\n" );
            return 0;
        }
        if ( Gia_ManPoNum(pAbc->pGia) != Gia_ManPoNum(pGold) )
        {
            Gia_ManStop( pGold );
            Abc_Print( -1, "Abc_CommandAbc9FFTest(): Old model and gold model have different number of POs.\n" );
            return 0;
        }
        printf( "Entered spec AIG from file \"%s\".\n", pFileName );
    }
    Gia_ManFaultTest( pAbc->pGia, pGold ? pGold : pAbc->pGia, pPars );
    Gia_ManStopP( &pGold );
    if ( pFileName2 )
        ABC_FREE( pPars->pFormStr );
    return 0;

usage:
    Abc_Print( -2, "usage: &fftest [-ATNK num] [-kbsfcdeunvh] <file> [-GF file] [-S str]\n" );
    Abc_Print( -2, "\t          performs functional fault test generation\n" );
    Abc_Print( -2, "\t-A num  : selects fault model for all gates [default = %d]\n", pPars->Algo );
    Abc_Print( -2, "\t                0: fault model is not selected (use -S str)\n" );
    Abc_Print( -2, "\t                1: delay fault testing for sequential circuits\n" );
    Abc_Print( -2, "\t                2: traditional stuck-at fault: -S (((a&b)&~p)|q)\n" );
    Abc_Print( -2, "\t                3: complement fault: -S ((a&b)^p)\n" );
    Abc_Print( -2, "\t                4: functionally observable fault\n" );
    Abc_Print( -2, "\t-T num  : specifies approximate runtime limit in seconds [default = %d]\n",        pPars->nTimeOut );
    Abc_Print( -2, "\t-N num  : specifies iteration to check for fixed parameters [default = %d]\n",     pPars->nIterCheck );
    Abc_Print( -2, "\t-K num  : specifies cardinality constraint (num > 0) [default = unused]\n" );
    Abc_Print( -2, "\t-k      : toggles non-strict cardinality (n <= K, instead of n == K) [default = %s]\n",pPars->fNonStrict?  "yes": "no" );
    Abc_Print( -2, "\t-b      : toggles testing for single faults (the same as \"-K 1\") [default = %s]\n", pPars->fBasic?      "yes": "no" );
    Abc_Print( -2, "\t-s      : toggles starting with the all-0 and all-1 patterns [default = %s]\n",    pPars->fStartPats?  "yes": "no" );
    Abc_Print( -2, "\t-f      : toggles faults at flop inputs only with \"-A 1\" and \"-S str\" [default = %s]\n",          pPars->fFfOnly?     "yes": "no" );
    Abc_Print( -2, "\t-c      : toggles checking if there are untestable faults [default = %s]\n",       pPars->fCheckUntest? "yes": "no" );
    Abc_Print( -2, "\t-d      : toggles dumping test patterns into file \"<file>_tests.txt\" [default = %s]\n", pPars->fDump?       "yes": "no" );
    Abc_Print( -2, "\t-e      : toggles dumping test pattern pairs (delay faults only) [default = %s]\n", pPars->fDumpDelay? "yes": "no" );
    Abc_Print( -2, "\t-u      : toggles dumping untestable faults into \"<file>_untest.txt\" [default = %s]\n", pPars->fDumpUntest? "yes": "no" );
    Abc_Print( -2, "\t-n      : toggles dumping faults not detected by a given test set [default = %s]\n", pPars->fDumpNewFaults? "yes": "no" );
    Abc_Print( -2, "\t-v      : toggles printing verbose information [default = %s]\n",                  pPars->fVerbose?    "yes": "no" );
    Abc_Print( -2, "\t-h      : print the command usage\n");
    Abc_Print( -2, "\t<file>  : (optional) file name with input test patterns\n\n");
    Abc_Print( -2, "\t-G file : (optional) file name with the golden model\n\n");
    Abc_Print( -2, "\t-F file : (optional) file name with the fault model in BLIF format\n");
    Abc_Print( -2, "\t-S str  : (optional) string representing the fault model\n");
    Abc_Print( -2, "\t          The following notations are used:\n");
    Abc_Print( -2, "\t            Functional variables: {a,b} (both a and b are always present)\n");
    Abc_Print( -2, "\t            Parameter variables: {p,q,r,s,t,u,v,w} (any number from 1 to 8)\n");
    Abc_Print( -2, "\t            Boolean operators: AND(&), OR(|), XOR(^), MUX(?:), NOT(~)\n");
    Abc_Print( -2, "\t            Parentheses should be used around each operator. Spaces not allowed.\n");
    Abc_Print( -2, "\t            Complement (~) is only allowed before variables (use DeMorgan law).\n");
    Abc_Print( -2, "\t            Examples:\n");
    Abc_Print( -2, "\t              (((a&b)&~p)|q)        stuck-at-0/1 at the output\n");
    Abc_Print( -2, "\t              (((a&~p)|q)&b)        stuck-at-0/1 at input a\n");
    Abc_Print( -2, "\t              (((a|p)&(b|q))&~r)    stuck-at-1 at the inputs and stuck-at-0 at the output\n");
    Abc_Print( -2, "\t              (((a&~p)&(b&~q))|r)   stuck-at-0 at the inputs and stuck-at-1 at the output\n");
    Abc_Print( -2, "\t              ((a&b)^p)             complement at the output\n");
    Abc_Print( -2, "\t              (((a^p)&(b^q))^r)     complement at the inputs and at the output\n");
    Abc_Print( -2, "\t              (a?(b?~s:r):(b?q:p))  functionally observable fault at the output\n");
    Abc_Print( -2, "\t              (p?(a|b):(a&b))       replace AND by OR\n");
    Abc_Print( -2, "\t           If the BLIF file is used for the formula with option \'-F\', following rules apply:\n");
    Abc_Print( -2, "\t              - the network should be combinational and have exactly one primary output\n");
    Abc_Print( -2, "\t              - input names should have only one character:\n");
    Abc_Print( -2, "\t                {a, b} (for functional variables)\n");
    Abc_Print( -2, "\t                {p,q,r,s,t,u,v,w} (for parameter variables)\n");
    return 1;
}